

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sdlvideo.cpp
# Opt level: O2

void __thiscall SDLFB::ScaleCoordsFromWindow(SDLFB *this,SWORD *x,SWORD *y)

{
  short sVar1;
  int iVar2;
  SWORD *pSVar3;
  int iVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined8 uVar7;
  undefined1 auVar8 [16];
  int h;
  int w;
  int realh;
  int realw;
  
  SDL_GetWindowSize(this->Screen,&w,&h);
  iVar2 = (*(this->super_DFrameBuffer).super_DSimpleCanvas.super_DCanvas.super_DObject._vptr_DObject
            [0x21])(this);
  if ((char)iVar2 == '\0') {
    *x = (SWORD)(((int)*x * (this->super_DFrameBuffer).super_DSimpleCanvas.super_DCanvas.Width) / w)
    ;
    sVar1 = (short)(((int)*y * (this->super_DFrameBuffer).super_DSimpleCanvas.super_DCanvas.Height)
                   / h);
  }
  else {
    realw = w;
    realh = h;
    ScaleWithAspect(&realw,&realh,(screen->super_DSimpleCanvas).super_DCanvas.Width,
                    (screen->super_DSimpleCanvas).super_DCanvas.Height);
    iVar2 = (screen->super_DSimpleCanvas).super_DCanvas.Width;
    if (realw == iVar2) {
      iVar4 = (screen->super_DSimpleCanvas).super_DCanvas.Height;
      if (realh == iVar4) {
        return;
      }
    }
    else {
      iVar4 = (screen->super_DSimpleCanvas).super_DCanvas.Height;
    }
    auVar5._0_8_ = (double)iVar4;
    auVar5._8_8_ = (double)iVar2;
    auVar8._0_8_ = (double)realh;
    auVar8._8_8_ = (double)realw;
    auVar6 = divpd(auVar5,auVar8);
    iVar2 = w - realw;
    pSVar3 = x;
    if (iVar2 == 0 || w < realw) {
      iVar2 = h - realh;
      uVar7 = auVar6._8_8_;
      auVar6._8_8_ = auVar6._0_8_;
      auVar6._0_8_ = uVar7;
      pSVar3 = y;
      y = x;
    }
    *pSVar3 = (short)(int)(auVar6._8_8_ * (double)(iVar2 / -2 + (int)*pSVar3));
    sVar1 = (short)(int)((double)(int)*y * auVar6._0_8_);
  }
  *y = sVar1;
  return;
}

Assistant:

void SDLFB::ScaleCoordsFromWindow(SWORD &x, SWORD &y)
{
	int w, h;
	SDL_GetWindowSize (Screen, &w, &h);

	// Detect if we're doing scaling in the Window and adjust the mouse
	// coordinates accordingly. This could be more efficent, but I
	// don't think performance is an issue in the menus.
	if(IsFullscreen())
	{
		int realw = w, realh = h;
		ScaleWithAspect (realw, realh, SCREENWIDTH, SCREENHEIGHT);
		if (realw != SCREENWIDTH || realh != SCREENHEIGHT)
		{
			double xratio = (double)SCREENWIDTH/realw;
			double yratio = (double)SCREENHEIGHT/realh;
			if (realw < w)
			{
				x = (x - (w - realw)/2)*xratio;
				y *= yratio;
			}
			else
			{
				y = (y - (h - realh)/2)*yratio;
				x *= xratio;
			}
		}
	}
	else
	{
		x = (SWORD)(x*Width/w);
		y = (SWORD)(y*Height/h);
	}
}